

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(required_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_6)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  walk_result wVar4;
  const_object_iterator cVar5;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  validation_message local_148;
  
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                    (instance);
  wVar4 = advance;
  if (bVar2) {
    eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::eval_context(&local_1a0,context,
                   &(this->
                    super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ).
                    super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    .keyword_name_);
    pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              &this->field_0xe8;
    for (__rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  &(this->
                   super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ).field_0xe0; __rhs != pbVar1; __rhs = __rhs + 1) {
      local_1c0._M_string_length = (size_type)(__rhs->_M_dataplus)._M_p;
      local_1c0._M_dataplus._M_p = (pointer)__rhs->_M_string_length;
      cVar5 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                               *)instance,(string_view_type *)&local_1c0);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_
                ((const_object_range_type *)&local_148,
                 (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)instance
                );
      if ((((undefined1  [16])cVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         ((local_148.keyword_.field_2._M_local_buf[8] & 1U) == 0)) {
        bVar2 = cVar5.has_value_ == (bool)local_148.keyword_.field_2._M_local_buf[8];
      }
      else {
        bVar2 = cVar5.it_._M_current._M_current ==
                (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)local_148.keyword_.field_2._M_allocated_capacity;
      }
      if (bVar2) {
        std::operator+(&local_168,"Required property \'",__rhs);
        std::operator+(&local_1c0,&local_168,"\' not found.");
        (*(this->
          super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ).
          super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          .super_validation_message_factory._vptr_validation_message_factory[2])
                  (&local_148,this,&local_1a0.eval_path_,instance_location,&local_1c0);
        reporter->error_count_ = reporter->error_count_ + 1;
        iVar3 = (*reporter->_vptr_error_reporter[2])(reporter,&local_148);
        validation_message::~validation_message(&local_148);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_168);
        if (iVar3 == 1) break;
      }
    }
    wVar4 = (walk_result)(__rhs != pbVar1);
    eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::~eval_context(&local_1a0);
  }
  return wVar4;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter, 
            Json& /*patch*/) const final
        {
            if (!instance.is_object())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            for (const auto& key : items_)
            {
                if(instance.find(key) == instance.object_range().end())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        "Required property '" + key + "' not found."));
                    if(result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            
            return walk_result::advance;
        }